

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

int yy_get_next_buffer(void)

{
  YY_BUFFER_STATE pyVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  int *piVar6;
  size_t sVar7;
  char *pcVar8;
  bool bVar9;
  int new_size_1;
  int n;
  int c;
  int new_size;
  int yy_c_buf_p_offset;
  YY_BUFFER_STATE b;
  int num_to_read;
  int ret_val;
  int i;
  int number_to_move;
  char *source;
  char *dest;
  undefined2 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffba;
  undefined1 in_stack_ffffffffffffffbb;
  undefined4 in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int local_28;
  int local_24;
  int local_20;
  char *local_18;
  char *local_10;
  int local_4;
  
  local_18 = yytext;
  if (yy_buffer_stack[yy_buffer_stack_top]->yy_ch_buf + (yy_n_chars + 1) < yy_c_buf_p) {
    yy_fatal_error((char *)0x108438);
  }
  if (yy_buffer_stack[yy_buffer_stack_top]->yy_fill_buffer == 0) {
    if ((long)yy_c_buf_p - (long)yytext == 1) {
      local_4 = 1;
    }
    else {
      local_4 = 2;
    }
  }
  else {
    iVar2 = ((int)yy_c_buf_p - (int)yytext) + -1;
    local_10 = yy_buffer_stack[yy_buffer_stack_top]->yy_ch_buf;
    for (local_20 = 0; local_20 < iVar2; local_20 = local_20 + 1) {
      *local_10 = *local_18;
      local_18 = local_18 + 1;
      local_10 = local_10 + 1;
    }
    if (yy_buffer_stack[yy_buffer_stack_top]->yy_buffer_status == 2) {
      yy_n_chars = 0;
      yy_buffer_stack[yy_buffer_stack_top]->yy_n_chars = 0;
    }
    else {
      local_28 = yy_buffer_stack[yy_buffer_stack_top]->yy_buf_size - iVar2;
      while (local_28 = local_28 + -1, local_28 < 1) {
        pyVar1 = yy_buffer_stack[yy_buffer_stack_top];
        pcVar8 = pyVar1->yy_ch_buf;
        iVar4 = (int)yy_c_buf_p;
        if (pyVar1->yy_is_our_buffer == 0) {
          pyVar1->yy_ch_buf = (char *)0x0;
        }
        else {
          if (pyVar1->yy_buf_size << 1 < 1) {
            pyVar1->yy_buf_size = pyVar1->yy_buf_size / 8 + pyVar1->yy_buf_size;
          }
          else {
            pyVar1->yy_buf_size = pyVar1->yy_buf_size << 1;
          }
          pcVar5 = (char *)yyrealloc((void *)CONCAT44(in_stack_ffffffffffffffc4,
                                                      in_stack_ffffffffffffffc0),
                                     CONCAT44(in_stack_ffffffffffffffbc,
                                              CONCAT13(in_stack_ffffffffffffffbb,
                                                       CONCAT12(in_stack_ffffffffffffffba,
                                                                in_stack_ffffffffffffffb8))));
          pyVar1->yy_ch_buf = pcVar5;
        }
        if (pyVar1->yy_ch_buf == (char *)0x0) {
          yy_fatal_error((char *)0x108617);
        }
        yy_c_buf_p = pyVar1->yy_ch_buf + (iVar4 - (int)pcVar8);
        local_28 = yy_buffer_stack[yy_buffer_stack_top]->yy_buf_size - iVar2;
      }
      if (0x2000 < local_28) {
        local_28 = 0x2000;
      }
      if (yy_buffer_stack[yy_buffer_stack_top]->yy_is_interactive == 0) {
        piVar6 = __errno_location();
        *piVar6 = 0;
        while( true ) {
          sVar7 = fread(yy_buffer_stack[yy_buffer_stack_top]->yy_ch_buf + iVar2,1,(long)local_28,
                        (FILE *)yyin);
          yy_n_chars = (int)sVar7;
          bVar9 = false;
          if (yy_n_chars == 0) {
            iVar4 = ferror((FILE *)yyin);
            bVar9 = iVar4 != 0;
          }
          if (!bVar9) break;
          piVar6 = __errno_location();
          if (*piVar6 != 4) {
            yy_fatal_error((char *)0x108807);
          }
          piVar6 = __errno_location();
          *piVar6 = 0;
          clearerr((FILE *)yyin);
        }
        in_stack_ffffffffffffffba = 0;
        iVar4 = yy_n_chars;
      }
      else {
        in_stack_ffffffffffffffc4 = 0x2a;
        iVar4 = 0;
        while( true ) {
          in_stack_ffffffffffffffbb = false;
          if (iVar4 < local_28) {
            in_stack_ffffffffffffffc4 = getc((FILE *)yyin);
            in_stack_ffffffffffffffbb = false;
            if (in_stack_ffffffffffffffc4 != -1) {
              in_stack_ffffffffffffffbb = in_stack_ffffffffffffffc4 != 10;
            }
          }
          if ((bool)in_stack_ffffffffffffffbb == false) break;
          yy_buffer_stack[yy_buffer_stack_top]->yy_ch_buf[(long)iVar4 + (long)iVar2] =
               (char)in_stack_ffffffffffffffc4;
          iVar4 = iVar4 + 1;
        }
        in_stack_ffffffffffffffc0 = iVar4;
        if (in_stack_ffffffffffffffc4 == 10) {
          in_stack_ffffffffffffffc0 = iVar4 + 1;
          yy_buffer_stack[yy_buffer_stack_top]->yy_ch_buf[(long)iVar4 + (long)iVar2] =
               (char)in_stack_ffffffffffffffc4;
        }
        iVar4 = in_stack_ffffffffffffffc0;
        if ((in_stack_ffffffffffffffc4 == -1) &&
           (iVar3 = ferror((FILE *)yyin), iVar4 = in_stack_ffffffffffffffc0, iVar3 != 0)) {
          yy_fatal_error((char *)0x108770);
        }
      }
      yy_n_chars = iVar4;
      yy_buffer_stack[yy_buffer_stack_top]->yy_n_chars = yy_n_chars;
    }
    if (yy_n_chars == 0) {
      if (iVar2 == 0) {
        local_24 = 1;
        yyrestart((FILE *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      }
      else {
        local_24 = 2;
        yy_buffer_stack[yy_buffer_stack_top]->yy_buffer_status = 2;
      }
    }
    else {
      local_24 = 0;
    }
    if (yy_buffer_stack[yy_buffer_stack_top]->yy_buf_size < yy_n_chars + iVar2) {
      iVar4 = yy_n_chars + iVar2 + (yy_n_chars >> 1);
      pcVar8 = (char *)yyrealloc((void *)CONCAT44(in_stack_ffffffffffffffc4,
                                                  in_stack_ffffffffffffffc0),
                                 CONCAT44(iVar4,CONCAT13(in_stack_ffffffffffffffbb,
                                                         CONCAT12(in_stack_ffffffffffffffba,
                                                                  in_stack_ffffffffffffffb8))));
      yy_buffer_stack[yy_buffer_stack_top]->yy_ch_buf = pcVar8;
      if (yy_buffer_stack[yy_buffer_stack_top]->yy_ch_buf == (char *)0x0) {
        yy_fatal_error((char *)0x10892c);
      }
      yy_buffer_stack[yy_buffer_stack_top]->yy_buf_size = iVar4 + -2;
    }
    yy_n_chars = iVar2 + yy_n_chars;
    yy_buffer_stack[yy_buffer_stack_top]->yy_ch_buf[yy_n_chars] = '\0';
    yy_buffer_stack[yy_buffer_stack_top]->yy_ch_buf[yy_n_chars + 1] = '\0';
    yytext = yy_buffer_stack[yy_buffer_stack_top]->yy_ch_buf;
    local_4 = local_24;
  }
  return local_4;
}

Assistant:

static int yy_get_next_buffer (void)
{
    	char *dest = YY_CURRENT_BUFFER_LVALUE->yy_ch_buf;
	char *source = (yytext_ptr);
	int number_to_move, i;
	int ret_val;

	if ( (yy_c_buf_p) > &YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[(yy_n_chars) + 1] )
		YY_FATAL_ERROR(
		"fatal flex scanner internal error--end of buffer missed" );

	if ( YY_CURRENT_BUFFER_LVALUE->yy_fill_buffer == 0 )
		{ /* Don't try to fill the buffer, so this is an EOF. */
		if ( (yy_c_buf_p) - (yytext_ptr) - YY_MORE_ADJ == 1 )
			{
			/* We matched a single character, the EOB, so
			 * treat this as a final EOF.
			 */
			return EOB_ACT_END_OF_FILE;
			}

		else
			{
			/* We matched some text prior to the EOB, first
			 * process it.
			 */
			return EOB_ACT_LAST_MATCH;
			}
		}

	/* Try to read more data. */

	/* First move last chars to start of buffer. */
	number_to_move = (int) ((yy_c_buf_p) - (yytext_ptr) - 1);

	for ( i = 0; i < number_to_move; ++i )
		*(dest++) = *(source++);

	if ( YY_CURRENT_BUFFER_LVALUE->yy_buffer_status == YY_BUFFER_EOF_PENDING )
		/* don't do the read, it's not guaranteed to return an EOF,
		 * just force an EOF
		 */
		YY_CURRENT_BUFFER_LVALUE->yy_n_chars = (yy_n_chars) = 0;

	else
		{
			int num_to_read =
			YY_CURRENT_BUFFER_LVALUE->yy_buf_size - number_to_move - 1;

		while ( num_to_read <= 0 )
			{ /* Not enough room in the buffer - grow it. */

			/* just a shorter name for the current buffer */
			YY_BUFFER_STATE b = YY_CURRENT_BUFFER_LVALUE;

			int yy_c_buf_p_offset =
				(int) ((yy_c_buf_p) - b->yy_ch_buf);

			if ( b->yy_is_our_buffer )
				{
				int new_size = b->yy_buf_size * 2;

				if ( new_size <= 0 )
					b->yy_buf_size += b->yy_buf_size / 8;
				else
					b->yy_buf_size *= 2;

				b->yy_ch_buf = (char *)
					/* Include room in for 2 EOB chars. */
					yyrealloc( (void *) b->yy_ch_buf,
							 (yy_size_t) (b->yy_buf_size + 2)  );
				}
			else
				/* Can't grow it, we don't own it. */
				b->yy_ch_buf = NULL;

			if ( ! b->yy_ch_buf )
				YY_FATAL_ERROR(
				"fatal error - scanner input buffer overflow" );

			(yy_c_buf_p) = &b->yy_ch_buf[yy_c_buf_p_offset];

			num_to_read = YY_CURRENT_BUFFER_LVALUE->yy_buf_size -
						number_to_move - 1;

			}

		if ( num_to_read > YY_READ_BUF_SIZE )
			num_to_read = YY_READ_BUF_SIZE;

		/* Read in more data. */
		YY_INPUT( (&YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[number_to_move]),
			(yy_n_chars), num_to_read );

		YY_CURRENT_BUFFER_LVALUE->yy_n_chars = (yy_n_chars);
		}

	if ( (yy_n_chars) == 0 )
		{
		if ( number_to_move == YY_MORE_ADJ )
			{
			ret_val = EOB_ACT_END_OF_FILE;
			yyrestart( yyin  );
			}

		else
			{
			ret_val = EOB_ACT_LAST_MATCH;
			YY_CURRENT_BUFFER_LVALUE->yy_buffer_status =
				YY_BUFFER_EOF_PENDING;
			}
		}

	else
		ret_val = EOB_ACT_CONTINUE_SCAN;

	if (((yy_n_chars) + number_to_move) > YY_CURRENT_BUFFER_LVALUE->yy_buf_size) {
		/* Extend the array by 50%, plus the number we really need. */
		int new_size = (yy_n_chars) + number_to_move + ((yy_n_chars) >> 1);
		YY_CURRENT_BUFFER_LVALUE->yy_ch_buf = (char *) yyrealloc(
			(void *) YY_CURRENT_BUFFER_LVALUE->yy_ch_buf, (yy_size_t) new_size  );
		if ( ! YY_CURRENT_BUFFER_LVALUE->yy_ch_buf )
			YY_FATAL_ERROR( "out of dynamic memory in yy_get_next_buffer()" );
		/* "- 2" to take care of EOB's */
		YY_CURRENT_BUFFER_LVALUE->yy_buf_size = (int) (new_size - 2);
	}

	(yy_n_chars) += number_to_move;
	YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[(yy_n_chars)] = YY_END_OF_BUFFER_CHAR;
	YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[(yy_n_chars) + 1] = YY_END_OF_BUFFER_CHAR;

	(yytext_ptr) = &YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[0];

	return ret_val;
}